

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O0

bool Memory::DefaultRecyclerCollectionWrapper::IsCollectionDisabled(Recycler *recycler)

{
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  undefined4 *puVar4;
  bool collectionDisabled;
  Recycler *recycler_local;
  
  bVar2 = Recycler::IsCollectionDisabled(recycler);
  if ((bVar2) &&
     ((bVar3 = Recycler::IsHeapEnumInProgress(recycler), !bVar3 ||
      (bVar3 = Recycler::AllowAllocationDuringHeapEnum(recycler), !bVar3)))) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x37,
                       "(recycler->IsHeapEnumInProgress() && recycler->AllowAllocationDuringHeapEnum())"
                       ,
                       "recycler->IsHeapEnumInProgress() && recycler->AllowAllocationDuringHeapEnum()"
                      );
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  return bVar2;
}

Assistant:

inline bool
DefaultRecyclerCollectionWrapper::IsCollectionDisabled(Recycler * recycler)
{
    // GC shouldn't be triggered during heap enum, unless we missed a case where it allocate memory (which
    // shouldn't happen during heap enum) or for the case we explicitly allow allocation
    // REVIEW: isHeapEnumInProgress should have been a collection state and checked before to avoid a check here.
    // Collection will be disabled in VarDispEx because it could be called from projection re-entrance as ASTA allows
    // QI/AddRef/Release to come back.
    bool collectionDisabled = recycler->IsCollectionDisabled();
#if DBG
    if (collectionDisabled)
    {
        // disabled collection should only happen if we allowed allocation during heap enum
        Assert(recycler->IsHeapEnumInProgress() && recycler->AllowAllocationDuringHeapEnum());
    }
#endif
    return collectionDisabled;
}